

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.cpp
# Opt level: O2

void __thiscall cppcms::widgets::select_base::element::element(element *this,string *v,string *msg)

{
  *(byte *)this = *(byte *)this & 0xfe;
  std::__cxx11::string::string((string *)&this->id,(string *)v);
  std::__cxx11::string::string((string *)&this->str_option,(string *)msg);
  booster::locale::basic_message<char>::basic_message(&this->tr_option);
  (this->d).ptr_ = (_data *)0x0;
  return;
}

Assistant:

select_base::element::element(std::string const &v,std::string const &msg) :
	need_translation(0),
	id(v),
	str_option(msg)
{
}